

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

FunctionValue *
CreateGenericFunctionInstance
          (FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
          FunctionValue proto,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
          bool standalone)

{
  int iVar1;
  Allocator *pAVar2;
  MatchData *pMVar3;
  long lVar4;
  long *plVar5;
  SynIdentifier *pSVar6;
  Lexeme *pLVar7;
  ScopeData *pSVar8;
  char *pcVar9;
  char *pcVar10;
  SynShortFunctionDefinition *syntax;
  ExprVariableDefinition *node;
  ExprBase *pEVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  IntrusiveList<MatchData> matches;
  bool bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ScopeData *parentType;
  undefined4 extraout_var;
  TypeFunction *argumentType;
  FunctionData **ppFVar18;
  __jmp_buf_tag *p_Var19;
  size_t sVar20;
  IntrusiveList<TypeHandle> *pIVar21;
  ArgumentData *pAVar22;
  SynFunctionDefinition *syntax_00;
  ExprBase *pEVar23;
  IntrusiveList<MatchData> *pIVar24;
  SynBase *pSVar25;
  byte bVar26;
  TraceScope *pTVar27;
  char *pcVar28;
  char *pcVar29;
  char *pcVar30;
  uint i;
  uint uVar31;
  ulong uVar32;
  TypeHandle *pTVar33;
  FunctionData *pFVar34;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  IntrusiveList<MatchData> aliases;
  TraceScope traceScope;
  ExprVariableDefinition *local_220;
  jmp_buf prevErrorHandler;
  SmallArray<CallArgumentData,_16U> result;
  
  pAVar2 = ctx->allocator;
  memset(result.little,0,0x100);
  result.count = 0;
  result.max = 0x10;
  uVar12 = ((proto.function)->arguments).data;
  uVar13 = ((proto.function)->arguments).count;
  functionArguments.count = uVar13;
  functionArguments.data = (ArgumentData *)uVar12;
  arguments_00.count = arguments.count;
  arguments_00.data = arguments.data;
  functionArguments._12_4_ = 0;
  arguments_00._12_4_ = 0;
  result.data = result.little;
  result.allocator = pAVar2;
  bVar14 = PrepareArgumentsForFunctionCall
                     (ctx,source,functionArguments,arguments_00,&result,(uint *)0x0,false);
  if (!bVar14) {
    __assert_fail("!\"unexpected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ab6,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  parentType = (ScopeData *)(proto.function)->scope->ownerType;
  if ((TypeStruct *)(proto.context)->type == ctx->typeAutoRef) {
    if ((parentType == (ScopeData *)0x0) ||
       (bVar26 = *(bool *)((long)&parentType->startOffset + 4), (bool)bVar26 == true)) {
      __assert_fail("function->scope->ownerType && !function->scope->ownerType->isGeneric",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1abc,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
LAB_00145238:
    if ((bVar26 & 1) != 0) {
      anon_unknown.dwarf_94284::Stop
                (ctx,source,"ERROR: generic type arguments required for type \'%.*s\'",
                 (ulong)(uint)(*(int *)&parentType->ownerFunction -
                              (int)((InplaceStr *)&parentType->ownerNamespace)->begin));
    }
  }
  else {
    if ((parentType != (ScopeData *)0x0) &&
       (parentType = ((TypeStruct *)(proto.context)->type)->typeScope,
       parentType != (ScopeData *)0x0)) {
      bVar26 = *(bool *)((long)&parentType->startOffset + 4);
      goto LAB_00145238;
    }
    parentType = (ScopeData *)0x0;
  }
  aliases.head = (MatchData *)0x0;
  aliases.tail = (MatchData *)0x0;
  pIVar24 = &(proto.function)->generics;
  for (pTVar33 = generics.head;
      (pMVar3 = pIVar24->head, pMVar3 != (MatchData *)0x0 && (pTVar33 != (TypeHandle *)0x0));
      pTVar33 = pTVar33->next) {
    if ((pTVar33->type != (TypeBase *)0x0) && (pTVar33->type->typeID == 0)) goto LAB_001455bf;
    iVar15 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    MatchData::MatchData((MatchData *)CONCAT44(extraout_var,iVar15),pMVar3->name,pTVar33->type);
    IntrusiveList<MatchData>::push_back(&aliases,(MatchData *)CONCAT44(extraout_var,iVar15));
    pIVar24 = (IntrusiveList<MatchData> *)&pMVar3->next;
  }
  arguments_01.count = result.count;
  arguments_01.data = result.data;
  arguments_01._12_4_ = 0;
  argumentType = GetGenericFunctionInstanceType
                           (ctx,source,(TypeBase *)parentType,proto.function,arguments_01,&aliases);
  if (argumentType == (TypeFunction *)0x0) {
    anon_unknown.dwarf_94284::Report
              (ctx,source,"ERROR: failed to instantiate generic function \'%.*s\'",
               (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                            (int)((proto.function)->name->name).begin));
LAB_001455bf:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
    goto LAB_0014592e;
  }
  if ((argumentType->super_TypeBase).isGeneric != false) {
    __assert_fail("!instance->isGeneric",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1adf,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  for (uVar31 = 0; uVar31 < ((proto.function)->instances).count; uVar31 = uVar31 + 1) {
    ppFVar18 = SmallArray<FunctionData_*,_8U>::operator[](&(proto.function)->instances,uVar31);
    pFVar34 = *ppFVar18;
    if (parentType == (ScopeData *)pFVar34->scope->ownerType) {
      prevErrorHandler[0].__jmpbuf[0] = (long)(pFVar34->generics).head;
      prevErrorHandler[0].__jmpbuf[1] = (long)(pFVar34->generics).tail;
      traceScope.ts = (double)generics.head;
      traceScope._8_8_ = generics.tail;
      uVar16 = IntrusiveList<MatchData>::size((IntrusiveList<MatchData> *)prevErrorHandler);
      uVar17 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)&traceScope);
      if (uVar16 == uVar17) {
        p_Var19 = prevErrorHandler;
        pTVar27 = &traceScope;
        while ((lVar4 = p_Var19->__jmpbuf[0], lVar4 != 0 &&
               (plVar5 = (long *)pTVar27->ts, plVar5 != (long *)0x0))) {
          if (*(long *)(lVar4 + 8) != *plVar5) goto LAB_001453d5;
          p_Var19 = (__jmp_buf_tag *)(lVar4 + 0x10);
          pTVar27 = (TraceScope *)(plVar5 + 1);
        }
        bVar14 = anon_unknown.dwarf_94284::SameArguments(pFVar34->type,argumentType);
        if (bVar14) {
          if (pFVar34->scope->ownerType == (TypeBase *)0x0) {
            if ((proto.context == (ExprBase *)0x0) || ((proto.context)->typeID != 9)) {
              __assert_fail("isType<ExprNullptrLiteral>(context)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1af3,
                            "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                           );
            }
            pSVar25 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
            proto.context = CreateFunctionContextAccess(ctx,pSVar25,pFVar34);
          }
          ppFVar18 = SmallArray<FunctionData_*,_8U>::operator[](&(proto.function)->instances,uVar31)
          ;
          FunctionValue::FunctionValue(__return_storage_ptr__,source,*ppFVar18,proto.context);
          goto LAB_0014592e;
        }
      }
    }
LAB_001453d5:
  }
  if ((CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
       ::token == '\0') &&
     (iVar15 = __cxa_guard_acquire(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                                    ::token), iVar15 != 0)) {
    CreateGenericFunctionInstance::token =
         NULLC::TraceGetToken("analyze","CreateGenericFunctionInstance");
    __cxa_guard_release(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,CreateGenericFunctionInstance::token);
  pSVar6 = (proto.function)->name;
  if ((pSVar6 != (SynIdentifier *)0x0) &&
     (pLVar7 = (pSVar6->super_SynBase).begin, pLVar7 != (Lexeme *)0x0)) {
    NULLC::TraceLabel(pLVar7->pos,((pSVar6->super_SynBase).end)->pos);
  }
  pSVar8 = ctx->scope;
  pSVar25 = (proto.function)->source;
  ctx->scope = (proto.function)->scope;
  ctx->lookupLocation = pSVar25;
  uVar31 = ctx->functionInstanceDepth + 1;
  ctx->functionInstanceDepth = uVar31;
  if (0x40 < uVar31) {
    anon_unknown.dwarf_94284::Stop
              (ctx,source,"ERROR: reached maximum generic function instance depth (%d)",0x40);
  }
  p_Var19 = ctx->errorHandler;
  memcpy(prevErrorHandler,p_Var19,200);
  bVar14 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar31 = *(uint *)(NULLC::traceContext + 0x244);
  iVar15 = _setjmp((__jmp_buf_tag *)p_Var19);
  if (iVar15 == 0) {
    syntax_00 = GetGenericFunctionDefinition(ctx,source,proto.function);
    if (syntax_00 == (SynFunctionDefinition *)0x0) {
      syntax = (SynShortFunctionDefinition *)(proto.function)->declaration->source;
      if ((syntax == (SynShortFunctionDefinition *)0x0) || ((syntax->super_SynBase).typeID != 0x39))
      {
        anon_unknown.dwarf_94284::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      pEVar23 = AnalyzeShortFunctionDefinition(ctx,syntax,proto.function,argumentType);
    }
    else {
      matches.tail = aliases.tail;
      matches.head = aliases.head;
      pEVar23 = AnalyzeFunctionDefinition
                          (ctx,syntax_00,proto.function,argumentType,(TypeBase *)parentType,matches,
                           false,false,false);
    }
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar8;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(p_Var19,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar14;
    if ((pEVar23 == (ExprBase *)0x0) || (pEVar23->typeID != 0x24)) {
      __assert_fail("definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1b66,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    node = *(ExprVariableDefinition **)&pEVar23[2].typeID;
    if (node != (ExprVariableDefinition *)0x0) {
      pEVar11 = (proto.function)->declaration;
      if ((pEVar11 == (ExprBase *)0x0) || (pEVar11->typeID != 0x25)) {
        local_220 = node;
        SmallArray<ExprBase_*,_128U>::push_back(&ctx->setup,(ExprBase **)&local_220);
      }
      else {
        IntrusiveList<ExprVariableDefinition>::push_back
                  ((IntrusiveList<ExprVariableDefinition> *)&pEVar11[1].typeID,node);
      }
    }
    if (standalone) goto LAB_00145914;
    pFVar34 = (FunctionData *)pEVar23[1]._vptr_ExprBase;
    if (pFVar34->scope->ownerType == (TypeBase *)0x0) {
      if ((proto.context == (ExprBase *)0x0) || ((proto.context)->typeID != 9)) {
        __assert_fail("isType<ExprNullptrLiteral>(context)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b77,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      pSVar25 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      proto.context =
           CreateFunctionContextAccess(ctx,pSVar25,(FunctionData *)pEVar23[1]._vptr_ExprBase);
      pFVar34 = (FunctionData *)pEVar23[1]._vptr_ExprBase;
    }
    pEVar23 = CreateSequence(ctx,source,pEVar23,proto.context);
    FunctionValue::FunctionValue(__return_storage_ptr__,source,pFVar34,pEVar23);
  }
  else {
    NULLC::TraceLeaveTo(uVar31);
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar8;
    ctx->lookupLocation = (SynBase *)0x0;
    pcVar29 = ctx->errorBuf;
    if (pcVar29 != (char *)0x0) {
      sVar20 = strlen(pcVar29);
      pcVar29 = pcVar29 + sVar20;
      iVar15 = NULLC::SafeSprintf(pcVar29,(ulong)(ctx->errorBufSize - (int)sVar20),
                                  "while instantiating generic function %.*s(",
                                  (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                                               (int)((proto.function)->name->name).begin));
      pcVar30 = pcVar29 + iVar15;
      pIVar21 = &(proto.function)->type->arguments;
      while( true ) {
        pTVar33 = pIVar21->head;
        uVar32 = (ulong)((*(int *)&ctx->errorBuf - (int)pcVar30) + ctx->errorBufSize);
        if (pTVar33 == (TypeHandle *)0x0) break;
        pcVar28 = ", ";
        if (pTVar33 == ((proto.function)->type->arguments).head) {
          pcVar28 = "";
        }
        iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,"%s%.*s",pcVar28,
                                    (ulong)(uint)(*(int *)&(pTVar33->type->name).end -
                                                 (int)(pTVar33->type->name).begin));
        pcVar30 = pcVar30 + iVar15;
        pIVar21 = (IntrusiveList<TypeHandle> *)&pTVar33->next;
      }
      iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,")");
      pcVar30 = pcVar30 + iVar15;
      if (arguments.count != 0) {
        iVar15 = NULLC::SafeSprintf(pcVar30,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar30) +
                                                   ctx->errorBufSize),"\n  using argument(s) (");
        pcVar30 = pcVar30 + iVar15;
        uVar31 = 0;
        while( true ) {
          uVar32 = (ulong)((*(int *)&ctx->errorBuf - (int)pcVar30) + ctx->errorBufSize);
          if (arguments.count <= uVar31) break;
          pcVar28 = ", ";
          if (uVar31 == 0) {
            pcVar28 = "";
          }
          pAVar22 = ArrayView<ArgumentData>::operator[](&arguments,uVar31);
          iVar15 = *(int *)&(pAVar22->type->name).end;
          pAVar22 = ArrayView<ArgumentData>::operator[](&arguments,uVar31);
          iVar1 = *(int *)&(pAVar22->type->name).begin;
          pAVar22 = ArrayView<ArgumentData>::operator[](&arguments,uVar31);
          iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,"%s%.*s",pcVar28,(ulong)(uint)(iVar15 - iVar1),
                                      (pAVar22->type->name).begin);
          pcVar30 = pcVar30 + iVar15;
          uVar31 = uVar31 + 1;
        }
        iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,")");
        pcVar30 = pcVar30 + iVar15;
      }
      if (aliases.head != (MatchData *)0x0) {
        iVar15 = NULLC::SafeSprintf(pcVar30,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar30) +
                                                   ctx->errorBufSize),"\n  with [");
        pcVar30 = pcVar30 + iVar15;
        pIVar24 = &aliases;
        while( true ) {
          pMVar3 = pIVar24->head;
          uVar32 = (ulong)((*(int *)&ctx->errorBuf - (int)pcVar30) + ctx->errorBufSize);
          if (pMVar3 == (MatchData *)0x0) break;
          pcVar28 = ", ";
          if (pMVar3 == aliases.head) {
            pcVar28 = "";
          }
          pcVar9 = (pMVar3->name->name).begin;
          pcVar10 = (pMVar3->type->name).begin;
          iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,"%s%.*s = %.*s",pcVar28,
                                      (ulong)(uint)(*(int *)&(pMVar3->name->name).end - (int)pcVar9)
                                      ,pcVar9,*(int *)&(pMVar3->type->name).end - (int)pcVar10,
                                      pcVar10);
          pcVar30 = pcVar30 + iVar15;
          pIVar24 = (IntrusiveList<MatchData> *)&pMVar3->next;
        }
        iVar15 = NULLC::SafeSprintf(pcVar30,uVar32,"]");
        pcVar30 = pcVar30 + iVar15;
      }
      anon_unknown.dwarf_94284::AddRelatedErrorInfoWithLocation(ctx,source,pcVar29,pcVar30);
    }
    memcpy(p_Var19,prevErrorHandler,200);
    ctx->errorHandlerNested = bVar14;
    if (bVar14 != false) {
      if (ctx->errorHandlerActive == false) {
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b52,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      longjmp((__jmp_buf_tag *)p_Var19,1);
    }
    ctx->errorCount = ctx->errorCount + 1;
LAB_00145914:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
  }
  NULLC::TraceScope::~TraceScope(&traceScope);
LAB_0014592e:
  SmallArray<CallArgumentData,_16U>::~SmallArray(&result);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue CreateGenericFunctionInstance(ExpressionContext &ctx, SynBase *source, FunctionValue proto, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool standalone)
{
	FunctionData *function = proto.function;

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false))
		assert(!"unexpected");

	TypeBase *parentType = NULL;

	if(proto.context->type == ctx.typeAutoRef)
	{
		assert(function->scope->ownerType && !function->scope->ownerType->isGeneric);
		parentType = function->scope->ownerType;
	}
	else if(function->scope->ownerType)
	{
		parentType = getType<TypeRef>(proto.context->type)->subType;
	}

	if(parentType && parentType->isGeneric)
		Stop(ctx, source, "ERROR: generic type arguments required for type '%.*s'", FMT_ISTR(parentType->name));

	IntrusiveList<MatchData> aliases;

	{
		MatchData *currMatch = function->generics.head;
		TypeHandle *currGeneric = generics.head;

		for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
		{
			if(isType<TypeError>(currGeneric->type))
				return FunctionValue();

			aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
		}
	}

	TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

	if(!instance)
	{
		Report(ctx, source, "ERROR: failed to instantiate generic function '%.*s'", FMT_ISTR(function->name->name));

		return FunctionValue();
	}

	assert(!instance->isGeneric);

	// Search for an existing function
	for(unsigned i = 0; i < function->instances.size(); i++)
	{
		FunctionData *data = function->instances[i];

		if(parentType != data->scope->ownerType)
			continue;

		if(!SameGenerics(data->generics, generics))
			continue;

		if(!SameArguments(data->type, instance))
			continue;

		ExprBase *context = proto.context;

		if(!data->scope->ownerType)
		{
			assert(isType<ExprNullptrLiteral>(context));

			context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), data);
		}

		return FunctionValue(source, function->instances[i], context);
	}

	TRACE_SCOPE("analyze", "CreateGenericFunctionInstance");

	if(proto.function->name && proto.function->name->begin)
		TRACE_LABEL2(proto.function->name->begin->pos, proto.function->name->end->pos);

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	ctx.functionInstanceDepth++;

	if(ctx.functionInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic function instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ExprBase *expr = NULL;
	
	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
			expr = AnalyzeFunctionDefinition(ctx, syntax, function, instance, parentType, aliases, false, false, false);
		else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(function->declaration->source))
			expr = AnalyzeShortFunctionDefinition(ctx, node, function, instance);
		else
			Stop(ctx, source, "ERROR: imported generic function call is not supported");
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.functionInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic function %.*s(", FMT_ISTR(function->name->name));

			for(TypeHandle *curr = function->type->arguments.head; curr; curr = curr->next)
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != function->type->arguments.head ? ", " : "", FMT_ISTR(curr->type->name));

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");

			if(!arguments.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  using argument(s) (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");
			}

			if(!aliases.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  with [");

				for(MatchData *curr = aliases.head; curr; curr = curr->next)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "]");
			}

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		return FunctionValue();
	}

	ctx.functionInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(expr);

	assert(definition);

	if(definition->contextVariableDefinition)
	{
		if(ExprGenericFunctionPrototype *genericProto = getType<ExprGenericFunctionPrototype>(function->declaration))
			genericProto->contextVariables.push_back(definition->contextVariableDefinition);
		else
			ctx.setup.push_back(definition->contextVariableDefinition);
	}

	if(standalone)
		return FunctionValue();

	ExprBase *context = proto.context;

	if(!definition->function->scope->ownerType)
	{
		assert(isType<ExprNullptrLiteral>(context));

		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function);
	}

	return FunctionValue(source, definition->function, CreateSequence(ctx, source, definition, context));
}